

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

void __thiscall BVFixed::ComplimentAll(BVFixed *this)

{
  BVIndex BVar1;
  ulong uVar2;
  
  WordCount(this->len);
  uVar2 = 0;
  do {
    this[uVar2 + 1] = (BVFixed)~(ulong)this[uVar2 + 1];
    uVar2 = uVar2 + 1;
    BVar1 = WordCount(this->len);
  } while (uVar2 < BVar1);
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::ComplimentAll()
{
    for(BVIndex i=0; i < this->WordCount(); i++)
    {
        this->data[i].ComplimentAll();
    }

    ClearEnd();
}